

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.c
# Opt level: O3

void golf_editor_draw(void)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int point1_idx;
  golf_level_t *level;
  golf_geo_t *pgVar18;
  golf_geo_point_t *pgVar19;
  golf_geo_face_t *pgVar20;
  int *piVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  mat4 m_03;
  mat4 m_04;
  mat4 m_05;
  mat4 m_06;
  mat4 m_07;
  mat4 m_08;
  mat4 m_09;
  mat4 m_10;
  mat4 m_11;
  mat4 m_12;
  mat4 m_13;
  mat4 m_14;
  mat4 m_15;
  mat4 m_16;
  mat4 m_17;
  mat4 m_18;
  mat4 m_19;
  mat4 m_20;
  mat4 m_21;
  mat4 m_22;
  mat4 m1;
  mat4 m_23;
  mat4 m_24;
  mat4 m_25;
  mat4 m_26;
  mat4 m_27;
  mat4 m_28;
  mat4 m_29;
  mat4 m_30;
  mat4 m_31;
  golf_movement_t movement;
  mat4 m2;
  golf_transform_t transform_01;
  golf_transform_t transform_02;
  golf_transform_t transform_03;
  golf_transform_t transform_04;
  golf_transform_t transform_05;
  golf_transform_t transform_06;
  vec3 v;
  vec3 v_00;
  quat q;
  vec3 v_01;
  undefined4 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined4 uVar31;
  wchar_t base_element;
  undefined1 auVar32 [16];
  _Bool _Var33;
  int iVar34;
  int iVar35;
  golf_config_t *cfg;
  golf_transform_t *pgVar36;
  golf_movement_t *pgVar37;
  golf_model_t *pgVar38;
  golf_texture_t *pgVar39;
  golf_shader_t *pgVar40;
  golf_shader_pipeline_t *pgVar41;
  golf_shader_uniform_t *pgVar42;
  golf_shader_uniform_t *uniform;
  golf_texture_t *pgVar43;
  golf_texture_t *pgVar44;
  golf_lightmap_section_t *pgVar45;
  ulong uVar46;
  long lVar47;
  golf_model_group_t *pgVar48;
  char *pcVar49;
  mat4 *pmVar50;
  uint uVar51;
  ulong uVar52;
  long lVar53;
  golf_entity_t *pgVar54;
  long lVar55;
  bool bVar56;
  byte bVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  vec3 vVar61;
  vec3 v_02;
  vec3 vVar62;
  vec3 v_04;
  vec4 vVar63;
  golf_edit_mode_entity_t gVar64;
  vec3 p1;
  int start_vertex;
  mat4 rotation_mat;
  golf_transform_t transform;
  golf_model_t *model;
  golf_transform_t transform_2;
  golf_transform_t transform_3;
  golf_transform_t world_transform;
  golf_lightmap_image_t lightmap_image;
  golf_transform_t world_transform_1;
  golf_model_group_t group;
  golf_transform_t moved_transform;
  mat4 model_mat;
  sg_pass_action action;
  float local_1198;
  float fStack_1194;
  float local_1188;
  float fStack_1184;
  ulong local_1158;
  mat4 local_1138;
  golf_shader_t *local_10f8;
  undefined4 in_stack_ffffffffffffef10;
  undefined4 in_stack_ffffffffffffef14;
  long in_stack_ffffffffffffef18;
  sg_buffer in_stack_ffffffffffffef20;
  sg_buffer in_stack_ffffffffffffef24;
  undefined8 in_stack_ffffffffffffef28;
  undefined8 in_stack_ffffffffffffef30;
  float local_10c8;
  float fStack_10c4;
  int aiStack_10c0 [2];
  int local_10b8 [2];
  int aiStack_10b0 [2];
  golf_transform_t local_10a8;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  golf_model_t *local_1060;
  undefined8 local_1058;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined4 local_1008;
  float fStack_1004;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  sg_range local_fe0;
  sg_range local_fd0;
  sg_range local_fc0;
  sg_range local_fb0;
  sg_range local_fa0;
  sg_range local_f90;
  sg_range local_f80;
  sg_range local_f70;
  sg_range local_f60;
  sg_range local_f50;
  sg_range local_f40;
  mat4 local_f30;
  sg_range local_ef0;
  sg_range local_ee0;
  golf_lightmap_image_t local_ed0;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  golf_transform_t local_de0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  mat4 local_da0;
  wchar_t local_d60;
  undefined4 local_d5c;
  mat4 local_d58;
  mat4 local_d18;
  undefined1 local_cd8 [8];
  sg_buffer sStack_cd0;
  sg_buffer sStack_ccc;
  undefined1 local_cc8 [16];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [16];
  undefined1 local_c98 [16];
  undefined1 local_c88 [48];
  uint32_t local_c58;
  uint32_t uStack_c54;
  undefined8 uStack_c50;
  undefined1 local_c48 [16];
  undefined1 local_c38 [16];
  undefined8 local_880;
  mat4 local_878;
  mat4 local_838;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  mat4 local_738;
  mat4 local_6f8;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined4 local_698;
  undefined4 uStack_694;
  undefined4 uStack_690;
  undefined4 uStack_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  mat4 local_638;
  mat4 local_5f8;
  mat4 local_5b8;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  sg_buffer local_4e8 [2];
  sg_buffer asStack_4e0 [2];
  char local_4d8 [8];
  int aiStack_4d0 [2];
  int local_4c8 [2];
  int aiStack_4c0 [266];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  sg_color local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  vec3 v_03;
  
  bVar57 = 0;
  cfg = golf_data_get_config("data/config/editor.cfg");
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68.r = 0.0;
  local_68.g = 0.0;
  local_68.b = 0.0;
  local_68.a = 0.0;
  local_78 = (undefined1  [16])0x0;
  local_38._0_1_ = '\0';
  local_38._1_3_ = 0;
  local_38._4_4_ = 0;
  local_98 = ZEXT816(0x100000000);
  local_88 = ZEXT816(0x3f80000000000000);
  sg_begin_default_pass
            ((sg_pass_action *)local_98,(int)(graphics->viewport_size).x,
             (int)(graphics->viewport_size).y);
  level = editor->level;
  if (0 < (level->entities).length) {
    lVar53 = 0;
    do {
      pgVar54 = (level->entities).data;
      if (pgVar54[lVar53].active == true) {
        pgVar54 = pgVar54 + lVar53;
        if (((WATER_ENTITY < pgVar54->type) || ((0x16U >> (pgVar54->type & 0x1f) & 1) == 0)) &&
           (pgVar38 = golf_entity_get_model(pgVar54), pgVar38 != (golf_model_t *)0x0)) {
          fVar59 = 1.0;
          if (pgVar54->type == MODEL_ENTITY) {
            fVar59 = (pgVar54->field_4).model.uv_scale;
          }
          pgVar36 = golf_entity_get_transform(pgVar54);
          if (pgVar36 != (golf_transform_t *)0x0) {
            golf_entity_get_world_transform((golf_transform_t *)&local_f30,level,pgVar54);
            pgVar37 = golf_entity_get_movement(pgVar54);
            if (pgVar37 == (golf_movement_t *)0x0) {
              transform_02.position.y = (float)in_stack_ffffffffffffef14;
              transform_02.position.x = (float)in_stack_ffffffffffffef10;
              transform_02.position.z = (float)(int)in_stack_ffffffffffffef18;
              transform_02.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
              transform_02.rotation.y = (float)in_stack_ffffffffffffef20.id;
              transform_02.rotation.z = (float)in_stack_ffffffffffffef24.id;
              transform_02.rotation.w = (float)in_stack_ffffffffffffef28;
              transform_02.scale.x = SUB84(in_stack_ffffffffffffef28,4);
              transform_02.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
              transform_02.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
              golf_transform_get_model_mat(transform_02);
              auVar32 = local_ca8;
              local_1138.m[0xc] = (float)local_ca8._0_4_;
              local_1138.m[0xd] = (float)local_ca8._4_4_;
              local_1138.m[0xe] = (float)local_ca8._8_4_;
              local_1138.m[0xf] = (float)local_ca8._12_4_;
              local_1138.m._32_8_ = local_cb8._0_8_;
              local_1138.m._40_8_ = local_cb8._8_8_;
              local_1138.m._16_8_ = local_cc8._0_8_;
              local_1138.m._24_8_ = local_cc8._8_8_;
              local_1138.m[0] = (float)local_cd8._0_4_;
              local_1138.m[1] = (float)local_cd8._4_4_;
              local_1138.m[2] = (float)sStack_cd0.id;
              local_1138.m[3] = (float)sStack_ccc.id;
              local_ca8 = auVar32;
            }
            else {
              local_4d8 = *(char (*) [8])((long)&pgVar37->field_4 + 0x10);
              local_4f8._0_8_ = *(undefined8 *)pgVar37;
              local_4f8._8_4_ = pgVar37->t0;
              local_4f8._12_4_ = pgVar37->length;
              uVar28 = pgVar37->type;
              uVar29 = pgVar37->repeats;
              uVar30 = *(undefined3 *)&pgVar37->field_0x5;
              uVar31 = pgVar37->t0;
              movement.t0 = (float)uVar31;
              movement._5_3_ = uVar30;
              movement.repeats = (_Bool)uVar29;
              movement.type = uVar28;
              local_4e8 = *(sg_buffer (*) [2])&pgVar37->field_4;
              asStack_4e0 = *(sg_buffer (*) [2])((long)&pgVar37->field_4 + 8);
              transform_00.position.z = local_f30.m[2];
              transform_00.position.x = local_f30.m[0];
              transform_00.position.y = local_f30.m[1];
              transform_00.rotation.x = local_f30.m[3];
              transform_00.rotation.y = local_f30.m[4];
              transform_00.rotation.z = local_f30.m[5];
              transform_00.rotation.w = local_f30.m[6];
              transform_00.scale.x = local_f30.m[7];
              transform_00.scale.y = local_f30.m[8];
              transform_00.scale.z = local_f30.m[9];
              movement.length = (float)local_4f8._12_4_;
              movement.field_4.linear.p0.x = (float)local_4e8[0].id;
              movement.field_4.linear.p0.y = (float)local_4e8[1].id;
              movement.field_4._8_4_ = asStack_4e0[0].id;
              movement.field_4._12_4_ = asStack_4e0[1].id;
              movement.field_4._16_1_ = local_4d8[0];
              movement.field_4._17_1_ = local_4d8[1];
              movement.field_4._18_1_ = local_4d8[2];
              movement.field_4._19_1_ = local_4d8[3];
              movement.field_4._20_1_ = local_4d8[4];
              movement.field_4._21_1_ = local_4d8[5];
              movement.field_4._22_1_ = local_4d8[6];
              movement.field_4._23_1_ = local_4d8[7];
              golf_transform_apply_movement
                        ((golf_transform_t *)local_cd8,transform_00,movement,editor->t);
              transform_01.position.y = (float)in_stack_ffffffffffffef14;
              transform_01.position.x = (float)in_stack_ffffffffffffef10;
              transform_01.position.z = (float)(int)in_stack_ffffffffffffef18;
              transform_01.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
              transform_01.rotation.y = (float)in_stack_ffffffffffffef20.id;
              transform_01.rotation.z = (float)in_stack_ffffffffffffef24.id;
              transform_01.rotation.w = (float)in_stack_ffffffffffffef28;
              transform_01.scale.x = SUB84(in_stack_ffffffffffffef28,4);
              transform_01.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
              transform_01.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
              golf_transform_get_model_mat(transform_01);
            }
            if (0 < (pgVar38->groups).length) {
              lVar55 = 0;
              do {
                pgVar48 = (pgVar38->groups).data + lVar55;
                pmVar50 = &local_da0;
                for (lVar47 = 0x12; lVar47 != 0; lVar47 = lVar47 + -1) {
                  pmVar50->m[0] = *(float *)pgVar48->material_name;
                  pgVar48 = (golf_model_group_t *)((long)pgVar48 + ((ulong)bVar57 * -2 + 1) * 4);
                  pmVar50 = (mat4 *)((long)pmVar50 + (ulong)bVar57 * -8 + 4);
                }
                _Var33 = golf_level_get_material
                                   (level,(char *)&local_da0,(golf_material_t *)local_cd8);
                if (!_Var33) {
                  golf_log_warning("Could not find material %s",&local_da0);
                  golf_material_texture
                            ((golf_material_t *)local_4f8,"",0.0,0.0,0.0,
                             "data/textures/fallback.png");
                  memcpy(local_cd8,(golf_material_t *)local_4f8,0x460);
                }
                if (local_c88._0_4_ == GOLF_MATERIAL_ENVIRONMENT) {
                  pgVar45 = golf_entity_get_lightmap_section(pgVar54);
                  if (pgVar45 == (golf_lightmap_section_t *)0x0) {
                    golf_log_warning("Cannot use environment material on entity with no lightmap");
                  }
                  else {
                    _Var33 = golf_level_get_lightmap_image(level,pgVar45->lightmap_name,&local_ed0);
                    base_element = local_d60;
                    uVar25 = local_1138.m._56_8_;
                    uVar24 = local_1138.m._48_8_;
                    uVar23 = local_1138.m._40_8_;
                    uVar22 = local_1138.m._32_8_;
                    if (_Var33) {
                      local_1058 = CONCAT44(local_1058._4_4_,local_d5c);
                      in_stack_ffffffffffffef10 = (undefined4)local_880;
                      in_stack_ffffffffffffef14 = (undefined4)((ulong)local_880 >> 0x20);
                      in_stack_ffffffffffffef20.id = local_1138.m[2];
                      in_stack_ffffffffffffef24.id = local_1138.m[3];
                      local_10c8 = local_1138.m[8];
                      fStack_10c4 = local_1138.m[9];
                      aiStack_10c0[0] = (int)local_1138.m[10];
                      aiStack_10c0[1] = (int)local_1138.m[0xb];
                      local_10b8[0] = (int)local_1138.m[0xc];
                      local_10b8[1] = (int)local_1138.m[0xd];
                      aiStack_10b0[0] = (int)local_1138.m[0xe];
                      aiStack_10b0[1] = (int)local_1138.m[0xf];
                      in_stack_ffffffffffffef18 = local_1138.m._0_8_;
                      in_stack_ffffffffffffef28 = local_1138.m._16_8_;
                      in_stack_ffffffffffffef30 = local_1138.m._24_8_;
                      pgVar40 = golf_data_get_shader("data/shaders/environment_material.glsl");
                      pgVar41 = golf_shader_get_pipeline(pgVar40,"environment_material");
                      sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
                      pgVar42 = golf_shader_get_vs_uniform(pgVar40,"environment_material_vs_params")
                      ;
                      local_4f8._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
                      local_4f8._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
                      local_4e8 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 4);
                      asStack_4e0 = *(sg_buffer (*) [2])((graphics->proj_view_mat).m + 6);
                      local_4d8 = *(char (*) [8])((graphics->proj_view_mat).m + 8);
                      aiStack_4d0 = *(int (*) [2])((graphics->proj_view_mat).m + 10);
                      local_4c8 = *(int (*) [2])((graphics->proj_view_mat).m + 0xc);
                      aiStack_4c0._0_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
                      m.m[3] = (float)SUB84(local_4f8._8_8_,4);
                      m.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
                      m.m[4] = (float)local_4e8[0].id;
                      m.m[5] = (float)local_4e8[1].id;
                      m.m[6] = (float)asStack_4e0[0].id;
                      m.m[7] = (float)asStack_4e0[1].id;
                      m.m[8] = (float)local_4d8._0_4_;
                      m.m[9] = (float)local_4d8._4_4_;
                      m.m[10] = (float)aiStack_4d0[0];
                      m.m[0xb] = (float)aiStack_4d0[1];
                      m.m[0xc] = (float)local_4c8[0];
                      m.m[0xd] = (float)local_4c8[1];
                      m.m[0xe] = (float)(int)aiStack_4c0._0_8_;
                      m.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
                      mat4_transpose(m);
                      m_00.m[2] = (float)(int)uStack_e18;
                      m_00.m[0] = (float)(undefined4)local_e20;
                      m_00.m[1] = (float)local_e20._4_4_;
                      m_00.m[3] = (float)(int)((ulong)uStack_e18 >> 0x20);
                      m_00.m[4] = (float)(int)local_e10;
                      m_00.m[5] = (float)(int)((ulong)local_e10 >> 0x20);
                      m_00.m[6] = (float)(int)uStack_e08;
                      m_00.m[7] = (float)(int)((ulong)uStack_e08 >> 0x20);
                      m_00.m[8] = (float)(int)local_e00;
                      m_00.m[9] = (float)(int)((ulong)local_e00 >> 0x20);
                      m_00.m[10] = (float)(int)uStack_df8;
                      m_00.m[0xb] = (float)(int)((ulong)uStack_df8 >> 0x20);
                      m_00.m[0xc] = (float)(int)local_df0;
                      m_00.m[0xd] = (float)(int)((ulong)local_df0 >> 0x20);
                      m_00.m[0xe] = (float)(int)uStack_de8;
                      m_00.m[0xf] = (float)((ulong)uStack_de8 >> 0x20);
                      golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_00);
                      m_01.m[2] = (float)in_stack_ffffffffffffef20.id;
                      m_01.m[0] = (float)(int)in_stack_ffffffffffffef18;
                      m_01.m[1] = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
                      m_01.m[3] = (float)in_stack_ffffffffffffef24.id;
                      m_01.m[4] = (float)(uint32_t)in_stack_ffffffffffffef28;
                      m_01.m[5] = (float)SUB84(in_stack_ffffffffffffef28,4);
                      m_01.m[6] = (float)(uint32_t)in_stack_ffffffffffffef30;
                      m_01.m[7] = (float)SUB84(in_stack_ffffffffffffef30,4);
                      m_01.m[8] = (float)uVar22;
                      m_01.m[9] = SUB84(uVar22,4);
                      m_01.m[10] = (float)(int)uVar23;
                      m_01.m[0xb] = (float)SUB84(uVar23,4);
                      m_01.m[0xc] = (float)(int)uVar24;
                      m_01.m[0xd] = (float)SUB84(uVar24,4);
                      m_01.m[0xe] = (float)(int)uVar25;
                      m_01.m[0xf] = SUB84(uVar25,4);
                      mat4_transpose(m_01);
                      m_02.m[2] = (float)(int)uStack_e58;
                      m_02.m[0] = (float)(undefined4)local_e60;
                      m_02.m[1] = (float)local_e60._4_4_;
                      m_02.m[3] = (float)(int)((ulong)uStack_e58 >> 0x20);
                      m_02.m[4] = (float)(int)local_e50;
                      m_02.m[5] = (float)(int)((ulong)local_e50 >> 0x20);
                      m_02.m[6] = (float)(int)uStack_e48;
                      m_02.m[7] = (float)(int)((ulong)uStack_e48 >> 0x20);
                      m_02.m[8] = (float)(int)local_e40;
                      m_02.m[9] = (float)(int)((ulong)local_e40 >> 0x20);
                      m_02.m[10] = (float)(int)uStack_e38;
                      m_02.m[0xb] = (float)(int)((ulong)uStack_e38 >> 0x20);
                      m_02.m[0xc] = (float)(int)local_e30;
                      m_02.m[0xd] = (float)(int)((ulong)local_e30 >> 0x20);
                      m_02.m[0xe] = (float)(int)uStack_e28;
                      m_02.m[0xf] = (float)((ulong)uStack_e28 >> 0x20);
                      golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_02);
                      local_d18.m._0_8_ = pgVar42->data;
                      local_d18.m._8_8_ = SEXT48(pgVar42->size);
                      sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',(sg_range *)&local_d18);
                      iVar35 = local_ed0.num_samples;
                      if (local_ed0.num_samples < 2 || local_ed0.time_length <= 0.0) {
                        local_1158 = 0;
                        lVar47 = 0;
                        fVar58 = 0.0;
                      }
                      else {
                        fVar58 = fmodf(editor->t,local_ed0.time_length);
                        fVar58 = fVar58 / local_ed0.time_length;
                        if ((local_ed0.repeats == true) && (fVar58 = fVar58 + fVar58, 1.0 < fVar58))
                        {
                          fVar58 = 2.0 - fVar58;
                        }
                        uVar51 = 1;
                        do {
                          if (fVar58 < (float)(int)uVar51 / (float)(int)(iVar35 - 1)) {
                            iVar34 = uVar51 - 1;
                            goto LAB_0010e0da;
                          }
                          uVar51 = uVar51 + 1;
                        } while (iVar35 != uVar51);
                        uVar51 = 0;
                        iVar34 = 0;
LAB_0010e0da:
                        fVar60 = (float)iVar34 / ((float)iVar35 + -1.0);
                        local_10f8 = pgVar40;
                        fVar58 = golf_clampf((fVar58 - fVar60) /
                                             ((float)(int)uVar51 / ((float)iVar35 + -1.0) - fVar60),
                                             0.0,1.0);
                        lVar47 = (long)iVar34;
                        local_1158 = (ulong)uVar51;
                        pgVar40 = local_10f8;
                      }
                      pgVar42 = golf_shader_get_fs_uniform(pgVar40,"environment_material_fs_params")
                      ;
                      vVar63 = vec4_create(0.0,0.0,0.0,0.0);
                      golf_shader_uniform_set_vec4(pgVar42,"ball_position",vVar63);
                      golf_shader_uniform_set_float(pgVar42,"lightmap_texture_a",fVar58);
                      golf_shader_uniform_set_float(pgVar42,"uv_scale",fVar59);
                      local_d58.m._0_8_ = pgVar42->data;
                      local_d58.m._8_8_ = SEXT48(pgVar42->size);
                      sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',(sg_range *)&local_d58);
                      memset((sg_bindings *)local_4f8,0,0xb0);
                      local_4f8._4_4_ = (pgVar38->sg_positions_buf).id;
                      uVar2 = pgVar38->sg_normals_buf;
                      uVar10 = pgVar38->sg_texcoords_buf;
                      local_4f8._12_4_ = uVar2;
                      local_4f8._8_4_ = uVar10;
                      local_4e8[0].id = (pgVar45->sg_uvs_buf).id;
                      aiStack_4c0[0x11] =
                           *(undefined4 *)
                            (CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10) + 0x18);
                      aiStack_4c0[0x12] = local_ed0.sg_image[lVar47].id;
                      aiStack_4c0[0x13] = local_ed0.sg_image[local_1158].id;
                      sg_apply_bindings((sg_bindings *)local_4f8);
                      sg_draw(base_element,(wchar_t)local_1058,L'\x01');
                    }
                    else {
                      golf_log_warning("Could not find lightmap %s",pgVar45);
                    }
                  }
                }
                lVar55 = lVar55 + 1;
              } while (lVar55 < (pgVar38->groups).length);
            }
          }
        }
      }
      lVar53 = lVar53 + 1;
      iVar35 = (level->entities).length;
    } while (lVar53 < iVar35);
    if (0 < iVar35) {
      lVar53 = 0;
      lVar55 = 0;
      do {
        pgVar54 = (level->entities).data;
        iVar35 = *(int *)(pgVar54->name + lVar53 + -4);
        pgVar54 = (golf_entity_t *)(pgVar54->name + lVar53 + -0xc);
        if (((editor->entity_settings).draw_camera_zones == true) && (iVar35 == 7)) {
          golf_entity_get_world_transform(&local_10a8,level,pgVar54);
          vVar62.z = local_10a8.position.z;
          vVar62.x = local_10a8.position.x;
          vVar62.y = local_10a8.position.y;
          mat4_translation((mat4 *)&local_ed0,vVar62);
          v_01.y = local_10a8.scale.y;
          v_01.x = local_10a8.scale.x;
          v_01.z = local_10a8.scale.z;
          mat4_scale(&local_da0,v_01);
          mat4_multiply_n((mat4 *)local_4f8,2);
          pgVar38 = golf_data_get_model("data/models/cube.obj");
          pgVar39 = golf_data_get_texture("data/textures/colors/red.png");
          pgVar40 = golf_data_get_shader("data/shaders/texture_material.glsl");
          pgVar41 = golf_shader_get_pipeline(pgVar40,"texture_material");
          sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
          pgVar42 = golf_shader_get_vs_uniform(pgVar40,"texture_material_vs_params");
          local_cd8 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
          _sStack_cd0 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
          pfVar1 = (graphics->proj_view_mat).m + 4;
          uVar22 = *(undefined8 *)pfVar1;
          uVar23 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
          local_cc8 = *(undefined1 (*) [16])pfVar1;
          pfVar1 = (graphics->proj_view_mat).m + 8;
          uVar24 = *(undefined8 *)pfVar1;
          uVar25 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
          local_cb8 = *(undefined1 (*) [16])pfVar1;
          pfVar1 = (graphics->proj_view_mat).m + 0xc;
          uVar26 = *(undefined8 *)pfVar1;
          uVar27 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
          local_ca8 = *(undefined1 (*) [16])pfVar1;
          m_03.m[3] = (float)SUB84(_sStack_cd0,4);
          m_03.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
          m_03.m[4] = (float)(int)uVar22;
          m_03.m[5] = (float)(int)((ulong)uVar22 >> 0x20);
          m_03.m[6] = (float)(int)uVar23;
          m_03.m[7] = (float)(int)((ulong)uVar23 >> 0x20);
          m_03.m[8] = (float)(int)uVar24;
          m_03.m[9] = (float)(int)((ulong)uVar24 >> 0x20);
          m_03.m[10] = (float)(int)uVar25;
          m_03.m[0xb] = (float)(int)((ulong)uVar25 >> 0x20);
          m_03.m[0xc] = (float)(int)uVar26;
          m_03.m[0xd] = (float)(int)((ulong)uVar26 >> 0x20);
          m_03.m[0xe] = (float)(int)uVar27;
          m_03.m[0xf] = (float)((ulong)uVar27 >> 0x20);
          mat4_transpose(m_03);
          m_04.m[2] = (float)(int)uStack_e18;
          m_04.m[0] = (float)(undefined4)local_e20;
          m_04.m[1] = (float)local_e20._4_4_;
          m_04.m[3] = (float)(int)((ulong)uStack_e18 >> 0x20);
          m_04.m[4] = (float)(int)local_e10;
          m_04.m[5] = (float)(int)((ulong)local_e10 >> 0x20);
          m_04.m[6] = (float)(int)uStack_e08;
          m_04.m[7] = (float)(int)((ulong)uStack_e08 >> 0x20);
          m_04.m[8] = (float)(int)local_e00;
          m_04.m[9] = (float)(int)((ulong)local_e00 >> 0x20);
          m_04.m[10] = (float)(int)uStack_df8;
          m_04.m[0xb] = (float)(int)((ulong)uStack_df8 >> 0x20);
          m_04.m[0xc] = (float)(int)local_df0;
          m_04.m[0xd] = (float)(int)((ulong)local_df0 >> 0x20);
          m_04.m[0xe] = (float)(int)uStack_de8;
          m_04.m[0xf] = (float)((ulong)uStack_de8 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_04);
          m_05.m[2] = (float)(uint32_t)local_4f8._8_8_;
          m_05.m[0] = (float)local_4f8._0_4_;
          m_05.m[1] = (float)local_4f8._4_4_;
          m_05.m[3] = (float)SUB84(local_4f8._8_8_,4);
          m_05.m[4] = (float)local_4e8[0].id;
          m_05.m[5] = (float)local_4e8[1].id;
          m_05.m[6] = (float)asStack_4e0[0].id;
          m_05.m[7] = (float)asStack_4e0[1].id;
          m_05.m[8] = (float)local_4d8._0_4_;
          m_05.m[9] = (float)local_4d8._4_4_;
          m_05.m[10] = (float)aiStack_4d0[0];
          m_05.m[0xb] = (float)aiStack_4d0[1];
          m_05.m[0xc] = (float)local_4c8[0];
          m_05.m[0xd] = (float)local_4c8[1];
          m_05.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_05.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          mat4_transpose(m_05);
          m_06.m[2] = (float)(int)uStack_e58;
          m_06.m[0] = (float)(undefined4)local_e60;
          m_06.m[1] = (float)local_e60._4_4_;
          m_06.m[3] = (float)(int)((ulong)uStack_e58 >> 0x20);
          m_06.m[4] = (float)(int)local_e50;
          m_06.m[5] = (float)(int)((ulong)local_e50 >> 0x20);
          m_06.m[6] = (float)(int)uStack_e48;
          m_06.m[7] = (float)(int)((ulong)uStack_e48 >> 0x20);
          m_06.m[8] = (float)(int)local_e40;
          m_06.m[9] = (float)(int)((ulong)local_e40 >> 0x20);
          m_06.m[10] = (float)(int)uStack_e38;
          m_06.m[0xb] = (float)(int)((ulong)uStack_e38 >> 0x20);
          m_06.m[0xc] = (float)(int)local_e30;
          m_06.m[0xd] = (float)(int)((ulong)local_e30 >> 0x20);
          m_06.m[0xe] = (float)(int)uStack_e28;
          m_06.m[0xf] = (float)((ulong)uStack_e28 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_06);
          local_ee0.ptr = pgVar42->data;
          local_ee0.size = (size_t)pgVar42->size;
          sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_ee0);
          uniform = golf_shader_get_fs_uniform(pgVar40,"fs_params");
          golf_shader_uniform_set_float(uniform,"alpha",0.4);
          local_ef0.ptr = uniform->data;
          local_ef0.size = (size_t)uniform->size;
          sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_ef0);
          memset((sg_bindings *)local_cd8,0,0xb0);
          local_cd8._4_4_ = (pgVar38->sg_positions_buf).id;
          uVar3 = pgVar38->sg_normals_buf;
          uVar11 = pgVar38->sg_texcoords_buf;
          sStack_ccc.id = uVar3;
          sStack_cd0.id = uVar11;
          local_c88._44_4_ = (pgVar39->sg_image).id;
          sg_apply_bindings((sg_bindings *)local_cd8);
          sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
          q.y = local_10a8.rotation.y;
          q.z = local_10a8.rotation.z;
          q.x = local_10a8.rotation.x;
          q.w = local_10a8.rotation.w;
          mat4_from_quat((mat4 *)&stack0xffffffffffffef18,q);
          v.z = local_10a8.position.z;
          v.x = local_10a8.position.x;
          v.y = local_10a8.position.y;
          mat4_translation(&local_f30,v);
          vVar61 = vec3_create(1.0,0.1,0.1);
          mat4_scale(&local_d18,vVar61);
          vVar61 = vec3_create(1.0,0.5,0.0);
          mat4_translation(&local_d58,vVar61);
          mat4_multiply_n(&local_1138,4);
          local_4c8[0] = (int)local_1138.m[0xc];
          local_4c8[1] = (int)local_1138.m[0xd];
          aiStack_4c0[0] = (int)local_1138.m[0xe];
          aiStack_4c0[1] = (int)local_1138.m[0xf];
          local_4d8 = (char  [8])local_1138.m._32_8_;
          aiStack_4d0[0] = (int)local_1138.m[10];
          aiStack_4d0[1] = (int)local_1138.m[0xb];
          local_4e8[0].id = (uint32_t)local_1138.m[4];
          local_4e8[1].id = (uint32_t)local_1138.m[5];
          asStack_4e0[0].id = (uint32_t)local_1138.m[6];
          asStack_4e0[1].id = (uint32_t)local_1138.m[7];
          local_4f8._0_4_ = local_1138.m[0];
          local_4f8._4_4_ = local_1138.m[1];
          local_4f8._8_4_ = local_1138.m[2];
          local_4f8._12_4_ = local_1138.m[3];
          local_1138.m._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
          local_1138.m._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
          local_1138.m._16_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 4);
          local_1138.m._24_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 6);
          local_1138.m._32_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 8);
          local_1138.m._40_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
          local_1138.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
          local_1138.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
          m_07.m[3] = (float)local_1138.m[3];
          m_07.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
          m_07.m[4] = (float)local_1138.m[4];
          m_07.m[5] = (float)local_1138.m[5];
          m_07.m[6] = (float)local_1138.m[6];
          m_07.m[7] = (float)local_1138.m[7];
          m_07.m[8] = (float)local_1138.m[8];
          m_07.m[9] = (float)local_1138.m[9];
          m_07.m[10] = (float)local_1138.m[10];
          m_07.m[0xb] = (float)local_1138.m[0xb];
          m_07.m[0xc] = (float)local_1138.m[0xc];
          m_07.m[0xd] = (float)local_1138.m[0xd];
          m_07.m[0xe] = (float)local_1138.m[0xe];
          m_07.m[0xf] = local_1138.m[0xf];
          mat4_transpose(m_07);
          m_08.m[2] = (float)(int)uStack_530;
          m_08.m[0] = (float)(undefined4)local_538;
          m_08.m[1] = (float)local_538._4_4_;
          m_08.m[3] = (float)(int)((ulong)uStack_530 >> 0x20);
          m_08.m[4] = (float)(int)local_528;
          m_08.m[5] = (float)(int)((ulong)local_528 >> 0x20);
          m_08.m[6] = (float)(int)uStack_520;
          m_08.m[7] = (float)(int)((ulong)uStack_520 >> 0x20);
          m_08.m[8] = (float)(int)local_518;
          m_08.m[9] = (float)(int)((ulong)local_518 >> 0x20);
          m_08.m[10] = (float)(int)uStack_510;
          m_08.m[0xb] = (float)(int)((ulong)uStack_510 >> 0x20);
          m_08.m[0xc] = (float)(int)local_508;
          m_08.m[0xd] = (float)(int)((ulong)local_508 >> 0x20);
          m_08.m[0xe] = (float)(int)uStack_500;
          m_08.m[0xf] = (float)((ulong)uStack_500 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_08);
          m_09.m[2] = (float)(uint32_t)local_4f8._8_8_;
          m_09.m[0] = (float)local_4f8._0_4_;
          m_09.m[1] = (float)local_4f8._4_4_;
          m_09.m[3] = (float)SUB84(local_4f8._8_8_,4);
          m_09.m[4] = (float)local_4e8[0].id;
          m_09.m[5] = (float)local_4e8[1].id;
          m_09.m[6] = (float)asStack_4e0[0].id;
          m_09.m[7] = (float)asStack_4e0[1].id;
          m_09.m[8] = local_4d8._0_4_;
          m_09.m[9] = local_4d8._4_4_;
          m_09.m[10] = (float)aiStack_4d0[0];
          m_09.m[0xb] = (float)aiStack_4d0[1];
          m_09.m[0xc] = (float)local_4c8[0];
          m_09.m[0xd] = (float)local_4c8[1];
          m_09.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_09.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          mat4_transpose(m_09);
          m_10.m[2] = (float)(int)uStack_570;
          m_10.m[0] = (float)(undefined4)local_578;
          m_10.m[1] = (float)local_578._4_4_;
          m_10.m[3] = (float)(int)((ulong)uStack_570 >> 0x20);
          m_10.m[4] = (float)(int)local_568;
          m_10.m[5] = (float)(int)((ulong)local_568 >> 0x20);
          m_10.m[6] = (float)(int)uStack_560;
          m_10.m[7] = (float)(int)((ulong)uStack_560 >> 0x20);
          m_10.m[8] = (float)(int)local_558;
          m_10.m[9] = (float)(int)((ulong)local_558 >> 0x20);
          m_10.m[10] = (float)(int)uStack_550;
          m_10.m[0xb] = (float)(int)((ulong)uStack_550 >> 0x20);
          m_10.m[0xc] = (float)(int)local_548;
          m_10.m[0xd] = (float)(int)((ulong)local_548 >> 0x20);
          m_10.m[0xe] = (float)(int)uStack_540;
          m_10.m[0xf] = (float)((ulong)uStack_540 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_10);
          local_f40.ptr = pgVar42->data;
          local_f40.size = (size_t)pgVar42->size;
          sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f40);
          golf_shader_uniform_set_float(uniform,"alpha",1.0);
          local_f50.ptr = uniform->data;
          local_f50.size = (size_t)uniform->size;
          sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f50);
          local_c88._44_4_ = (pgVar39->sg_image).id;
          local_cd8 = (undefined1  [8])((ulong)(pgVar38->sg_positions_buf).id << 0x20);
          uVar4 = pgVar38->sg_normals_buf;
          uVar12 = pgVar38->sg_texcoords_buf;
          sStack_ccc.id = uVar4;
          sStack_cd0.id = uVar12;
          local_c88._32_12_ = SUB1612((undefined1  [16])0x0,4);
          local_c88._16_8_ = 0;
          local_c88._24_4_ = 0;
          local_c88._28_4_ = 0;
          local_c88._0_16_ = (undefined1  [16])0x0;
          local_c98 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          _local_c58 = (undefined1  [16])0x0;
          sg_apply_bindings((sg_bindings *)local_cd8);
          sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
          pgVar38 = golf_data_get_model("data/models/sphere.obj");
          v_00.z = local_10a8.position.z;
          v_00.x = local_10a8.position.x;
          v_00.y = local_10a8.position.y;
          mat4_translation(&local_5b8,v_00);
          vVar61 = vec3_create(2.0,0.1,0.0);
          mat4_translation(&local_5f8,vVar61);
          vVar61 = vec3_create(0.2,0.2,0.2);
          mat4_scale(&local_638,vVar61);
          mat4_multiply_n(&local_1138,4);
          local_4c8[0] = (int)local_1138.m[0xc];
          local_4c8[1] = (int)local_1138.m[0xd];
          aiStack_4c0[0] = (int)local_1138.m[0xe];
          aiStack_4c0[1] = (int)local_1138.m[0xf];
          local_4d8 = (char  [8])local_1138.m._32_8_;
          aiStack_4d0[0] = (int)local_1138.m[10];
          aiStack_4d0[1] = (int)local_1138.m[0xb];
          local_4e8[0].id = (uint32_t)local_1138.m[4];
          local_4e8[1].id = (uint32_t)local_1138.m[5];
          asStack_4e0[0].id = (uint32_t)local_1138.m[6];
          asStack_4e0[1].id = (uint32_t)local_1138.m[7];
          local_4f8._0_4_ = local_1138.m[0];
          local_4f8._4_4_ = local_1138.m[1];
          local_4f8._8_4_ = local_1138.m[2];
          local_4f8._12_4_ = local_1138.m[3];
          local_1138.m._0_8_ = *(undefined8 *)(graphics->proj_view_mat).m;
          local_1138.m._8_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 2);
          local_1138.m[4] = (graphics->proj_view_mat).m[4];
          local_1138.m[5] = (graphics->proj_view_mat).m[5];
          local_1138.m._24_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 6);
          local_1138.m[8] = (graphics->proj_view_mat).m[8];
          local_1138.m[9] = (graphics->proj_view_mat).m[9];
          local_1138.m._40_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 10);
          local_1138.m._48_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
          local_1138.m._56_8_ = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
          m_11.m[3] = (float)local_1138.m[3];
          m_11.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
          m_11.m[4] = local_1138.m[4];
          m_11.m[5] = local_1138.m[5];
          m_11.m[6] = (float)local_1138.m[6];
          m_11.m[7] = (float)local_1138.m[7];
          m_11.m[8] = local_1138.m[8];
          m_11.m[9] = local_1138.m[9];
          m_11.m[10] = (float)local_1138.m[10];
          m_11.m[0xb] = (float)local_1138.m[0xb];
          m_11.m[0xc] = (float)local_1138.m[0xc];
          m_11.m[0xd] = (float)local_1138.m[0xd];
          m_11.m[0xe] = (float)local_1138.m[0xe];
          m_11.m[0xf] = local_1138.m[0xf];
          mat4_transpose(m_11);
          m_12.m[2] = (float)(int)uStack_670;
          m_12.m[0] = (float)(undefined4)local_678;
          m_12.m[1] = (float)local_678._4_4_;
          m_12.m[3] = (float)(int)((ulong)uStack_670 >> 0x20);
          m_12.m[4] = (float)(int)local_668;
          m_12.m[5] = (float)(int)((ulong)local_668 >> 0x20);
          m_12.m[6] = (float)(int)uStack_660;
          m_12.m[7] = (float)(int)((ulong)uStack_660 >> 0x20);
          m_12.m[8] = (float)(int)local_658;
          m_12.m[9] = (float)(int)((ulong)local_658 >> 0x20);
          m_12.m[10] = (float)(int)uStack_650;
          m_12.m[0xb] = (float)(int)((ulong)uStack_650 >> 0x20);
          m_12.m[0xc] = (float)(int)local_648;
          m_12.m[0xd] = (float)(int)((ulong)local_648 >> 0x20);
          m_12.m[0xe] = (float)(int)uStack_640;
          m_12.m[0xf] = (float)((ulong)uStack_640 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_12);
          m_13.m[2] = (float)(uint32_t)local_4f8._8_8_;
          m_13.m[0] = (float)local_4f8._0_4_;
          m_13.m[1] = (float)local_4f8._4_4_;
          m_13.m[3] = (float)SUB84(local_4f8._8_8_,4);
          m_13.m[4] = (float)local_4e8[0].id;
          m_13.m[5] = (float)local_4e8[1].id;
          m_13.m[6] = (float)asStack_4e0[0].id;
          m_13.m[7] = (float)asStack_4e0[1].id;
          m_13.m[8] = (float)local_4d8._0_4_;
          m_13.m[9] = (float)local_4d8._4_4_;
          m_13.m[10] = (float)aiStack_4d0[0];
          m_13.m[0xb] = (float)aiStack_4d0[1];
          m_13.m[0xc] = (float)local_4c8[0];
          m_13.m[0xd] = (float)local_4c8[1];
          m_13.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_13.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          mat4_transpose(m_13);
          m_14.m[2] = (float)(int)uStack_6b0;
          m_14.m[0] = (float)(undefined4)local_6b8;
          m_14.m[1] = (float)local_6b8._4_4_;
          m_14.m[3] = (float)(int)((ulong)uStack_6b0 >> 0x20);
          m_14.m[4] = (float)(int)local_6a8;
          m_14.m[5] = (float)(int)((ulong)local_6a8 >> 0x20);
          m_14.m[6] = (float)(int)uStack_6a0;
          m_14.m[7] = (float)(int)((ulong)uStack_6a0 >> 0x20);
          m_14.m[8] = (float)local_698;
          m_14.m[9] = (float)uStack_694;
          m_14.m[10] = (float)uStack_690;
          m_14.m[0xb] = (float)uStack_68c;
          m_14.m[0xc] = (float)(int)local_688;
          m_14.m[0xd] = (float)(int)((ulong)local_688 >> 0x20);
          m_14.m[0xe] = (float)(int)uStack_680;
          m_14.m[0xf] = (float)((ulong)uStack_680 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_14);
          local_f60.ptr = pgVar42->data;
          local_f60.size = (size_t)pgVar42->size;
          sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f60);
          golf_shader_uniform_set_float(uniform,"alpha",1.0);
          local_f70.ptr = uniform->data;
          local_f70.size = (size_t)uniform->size;
          sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f70);
          local_c88._44_4_ = (pgVar39->sg_image).id;
          local_cd8 = (undefined1  [8])((ulong)(pgVar38->sg_positions_buf).id << 0x20);
          uVar5 = pgVar38->sg_normals_buf;
          uVar13 = pgVar38->sg_texcoords_buf;
          sStack_ccc.id = uVar5;
          sStack_cd0.id = uVar13;
          local_c88._32_12_ = SUB1612((undefined1  [16])0x0,4);
          local_c88._16_8_ = 0;
          local_c88._24_4_ = 0;
          local_c88._28_4_ = 0;
          local_c88._0_16_ = (undefined1  [16])0x0;
          local_c98 = (undefined1  [16])0x0;
          local_ca8 = (undefined1  [16])0x0;
          local_cb8 = (undefined1  [16])0x0;
          local_cc8 = (undefined1  [16])0x0;
          local_c38 = (undefined1  [16])0x0;
          local_c48 = (undefined1  [16])0x0;
          _local_c58 = (undefined1  [16])0x0;
LAB_0010f194:
          sg_apply_bindings((sg_bindings *)local_cd8);
          sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
        }
        else if (iVar35 == 1) {
          pgVar38 = golf_data_get_model("data/models/sphere.obj");
          pgVar39 = golf_data_get_texture("data/textures/colors/red.png");
          golf_entity_get_world_transform
                    ((golf_transform_t *)&stack0xffffffffffffef18,level,pgVar54);
          vVar61.z = (float)in_stack_ffffffffffffef20.id;
          vVar61.x = (float)(int)in_stack_ffffffffffffef18;
          vVar61.y = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
          mat4_translation(&local_6f8,vVar61);
          vVar61 = vec3_create(0.12,0.12,0.12);
          mat4_scale(&local_738,vVar61);
          mat4_multiply_n((mat4 *)local_4f8,2);
          pgVar40 = golf_data_get_shader("data/shaders/texture_material.glsl");
          pgVar41 = golf_shader_get_pipeline(pgVar40,"texture_material");
          sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
          pgVar42 = golf_shader_get_vs_uniform(pgVar40,"texture_material_vs_params");
          local_cd8 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
          _sStack_cd0 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
          pfVar1 = (graphics->proj_view_mat).m + 4;
          uVar22 = *(undefined8 *)pfVar1;
          uVar23 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
          local_cc8 = *(undefined1 (*) [16])pfVar1;
          pfVar1 = (graphics->proj_view_mat).m + 8;
          uVar24 = *(undefined8 *)pfVar1;
          uVar25 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
          local_cb8 = *(undefined1 (*) [16])pfVar1;
          pfVar1 = (graphics->proj_view_mat).m + 0xc;
          uVar26 = *(undefined8 *)pfVar1;
          uVar27 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
          local_ca8 = *(undefined1 (*) [16])pfVar1;
          m_15.m[3] = (float)SUB84(_sStack_cd0,4);
          m_15.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
          m_15.m[4] = (float)(int)uVar22;
          m_15.m[5] = (float)(int)((ulong)uVar22 >> 0x20);
          m_15.m[6] = (float)(int)uVar23;
          m_15.m[7] = (float)(int)((ulong)uVar23 >> 0x20);
          m_15.m[8] = (float)(int)uVar24;
          m_15.m[9] = (float)(int)((ulong)uVar24 >> 0x20);
          m_15.m[10] = (float)(int)uVar25;
          m_15.m[0xb] = (float)(int)((ulong)uVar25 >> 0x20);
          m_15.m[0xc] = (float)(int)uVar26;
          m_15.m[0xd] = (float)(int)((ulong)uVar26 >> 0x20);
          m_15.m[0xe] = (float)(int)uVar27;
          m_15.m[0xf] = (float)((ulong)uVar27 >> 0x20);
          mat4_transpose(m_15);
          m_16.m[2] = (float)(int)uStack_770;
          m_16.m[0] = (float)(undefined4)local_778;
          m_16.m[1] = (float)local_778._4_4_;
          m_16.m[3] = (float)(int)((ulong)uStack_770 >> 0x20);
          m_16.m[4] = (float)(int)local_768;
          m_16.m[5] = (float)(int)((ulong)local_768 >> 0x20);
          m_16.m[6] = (float)(int)uStack_760;
          m_16.m[7] = (float)(int)((ulong)uStack_760 >> 0x20);
          m_16.m[8] = (float)(int)local_758;
          m_16.m[9] = (float)(int)((ulong)local_758 >> 0x20);
          m_16.m[10] = (float)(int)uStack_750;
          m_16.m[0xb] = (float)(int)((ulong)uStack_750 >> 0x20);
          m_16.m[0xc] = (float)(int)local_748;
          m_16.m[0xd] = (float)(int)((ulong)local_748 >> 0x20);
          m_16.m[0xe] = (float)(int)uStack_740;
          m_16.m[0xf] = (float)((ulong)uStack_740 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_16);
          m_17.m[2] = (float)(uint32_t)local_4f8._8_8_;
          m_17.m[0] = (float)local_4f8._0_4_;
          m_17.m[1] = (float)local_4f8._4_4_;
          m_17.m[3] = (float)SUB84(local_4f8._8_8_,4);
          m_17.m[4] = (float)local_4e8[0].id;
          m_17.m[5] = (float)local_4e8[1].id;
          m_17.m[6] = (float)asStack_4e0[0].id;
          m_17.m[7] = (float)asStack_4e0[1].id;
          m_17.m[8] = (float)local_4d8._0_4_;
          m_17.m[9] = (float)local_4d8._4_4_;
          m_17.m[10] = (float)aiStack_4d0[0];
          m_17.m[0xb] = (float)aiStack_4d0[1];
          m_17.m[0xc] = (float)local_4c8[0];
          m_17.m[0xd] = (float)local_4c8[1];
          m_17.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_17.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          mat4_transpose(m_17);
          m_18.m[2] = (float)(int)uStack_7b0;
          m_18.m[0] = (float)(undefined4)local_7b8;
          m_18.m[1] = (float)local_7b8._4_4_;
          m_18.m[3] = (float)(int)((ulong)uStack_7b0 >> 0x20);
          m_18.m[4] = (float)(int)local_7a8;
          m_18.m[5] = (float)(int)((ulong)local_7a8 >> 0x20);
          m_18.m[6] = (float)(int)uStack_7a0;
          m_18.m[7] = (float)(int)((ulong)uStack_7a0 >> 0x20);
          m_18.m[8] = (float)local_798;
          m_18.m[9] = (float)uStack_794;
          m_18.m[10] = (float)uStack_790;
          m_18.m[0xb] = (float)uStack_78c;
          m_18.m[0xc] = (float)(int)local_788;
          m_18.m[0xd] = (float)(int)((ulong)local_788 >> 0x20);
          m_18.m[0xe] = (float)(int)uStack_780;
          m_18.m[0xf] = (float)((ulong)uStack_780 >> 0x20);
          golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_18);
          local_f80.ptr = pgVar42->data;
          local_f80.size = (size_t)pgVar42->size;
          sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_f80);
          pgVar42 = golf_shader_get_fs_uniform(pgVar40,"fs_params");
          golf_shader_uniform_set_float(pgVar42,"alpha",1.0);
          local_f90.ptr = pgVar42->data;
          local_f90.size = (size_t)pgVar42->size;
          sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_f90);
          memset(local_cd8,0,0xb0);
          local_cd8._4_4_ = (pgVar38->sg_positions_buf).id;
          uVar6 = pgVar38->sg_normals_buf;
          uVar14 = pgVar38->sg_texcoords_buf;
          sStack_ccc.id = uVar6;
          sStack_cd0.id = uVar14;
          local_c88._44_4_ = (pgVar39->sg_image).id;
          goto LAB_0010f194;
        }
        lVar55 = lVar55 + 1;
        lVar53 = lVar53 + 0x510;
      } while (lVar55 < (level->entities).length);
    }
  }
  pgVar40 = golf_data_get_shader("data/shaders/editor_water.glsl");
  pgVar41 = golf_shader_get_pipeline(pgVar40,"editor_water");
  sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
  iVar35 = (level->entities).length;
  if (0 < iVar35) {
    lVar55 = 0;
    lVar53 = 0;
    do {
      pgVar54 = (level->entities).data;
      if ((pgVar54->name[lVar55 + -0xc] == '\x01') && (*(int *)(pgVar54->name + lVar55 + -4) == 4))
      {
        pgVar54 = (golf_entity_t *)(pgVar54->name + lVar55 + -0xc);
        pgVar38 = golf_entity_get_model(pgVar54);
        golf_entity_get_world_transform(&local_de0,level,pgVar54);
        transform_03.position.y = (float)in_stack_ffffffffffffef14;
        transform_03.position.x = (float)in_stack_ffffffffffffef10;
        transform_03.position.z = (float)(int)in_stack_ffffffffffffef18;
        transform_03.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
        transform_03.rotation.y = (float)in_stack_ffffffffffffef20.id;
        transform_03.rotation.z = (float)in_stack_ffffffffffffef24.id;
        transform_03.rotation.w = (float)in_stack_ffffffffffffef28;
        transform_03.scale.x = SUB84(in_stack_ffffffffffffef28,4);
        transform_03.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
        transform_03.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
        golf_transform_get_model_mat(transform_03);
        pgVar39 = golf_data_get_texture("data/textures/colors/white.png");
        pgVar43 = golf_data_get_texture("data/textures/water_noise_1.png");
        pgVar44 = golf_data_get_texture("data/textures/water_noise_2.png");
        pgVar45 = golf_entity_get_lightmap_section(pgVar54);
        memset(local_cd8,0,0xb0);
        local_cd8._4_4_ = (pgVar38->sg_positions_buf).id;
        sStack_ccc.id = (pgVar45->sg_uvs_buf).id;
        sStack_cd0.id = (pgVar38->sg_texcoords_buf).id;
        local_c88._44_4_ = (pgVar39->sg_image).id;
        uStack_c54 = (pgVar44->sg_image).id;
        local_c58 = (pgVar43->sg_image).id;
        sg_apply_bindings((sg_bindings *)local_cd8);
        pgVar42 = golf_shader_get_vs_uniform(pgVar40,"editor_water_vs_params");
        m_19.m[2] = (float)(uint32_t)local_4f8._8_8_;
        m_19.m[0] = (float)local_4f8._0_4_;
        m_19.m[1] = (float)local_4f8._4_4_;
        m_19.m[3] = (float)SUB84(local_4f8._8_8_,4);
        m_19.m[4] = (float)local_4e8[0].id;
        m_19.m[5] = (float)local_4e8[1].id;
        m_19.m[6] = (float)asStack_4e0[0].id;
        m_19.m[7] = (float)asStack_4e0[1].id;
        m_19.m[8] = (float)local_4d8._0_4_;
        m_19.m[9] = (float)local_4d8._4_4_;
        m_19.m[10] = (float)aiStack_4d0[0];
        m_19.m[0xb] = (float)aiStack_4d0[1];
        m_19.m[0xc] = (float)local_4c8[0];
        m_19.m[0xd] = (float)local_4c8[1];
        m_19.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_19.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_19);
        m_20.m[2] = (float)in_stack_ffffffffffffef20.id;
        m_20.m[0] = (float)(int)in_stack_ffffffffffffef18;
        m_20.m[1] = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
        m_20.m[3] = (float)in_stack_ffffffffffffef24.id;
        m_20.m[4] = (float)(uint32_t)in_stack_ffffffffffffef28;
        m_20.m[5] = (float)SUB84(in_stack_ffffffffffffef28,4);
        m_20.m[6] = (float)(uint32_t)in_stack_ffffffffffffef30;
        m_20.m[7] = (float)SUB84(in_stack_ffffffffffffef30,4);
        m_20.m[8] = (float)_local_10c8;
        m_20.m[9] = SUB84(_local_10c8,4);
        m_20.m[10] = (float)aiStack_10c0[0];
        m_20.m[0xb] = (float)aiStack_10c0[1];
        m_20.m[0xc] = (float)local_10b8[0];
        m_20.m[0xd] = (float)local_10b8[1];
        m_20.m[0xe] = (float)aiStack_10b0[0];
        m_20.m[0xf] = aiStack_10b0[1];
        golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_20);
        pmVar50 = &graphics->proj_view_mat;
        local_10a8.position.x = pmVar50->m[0];
        local_10a8.position.y = pmVar50->m[1];
        uVar22 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        local_10a8.rotation.y = (graphics->proj_view_mat).m[4];
        local_10a8.rotation.z = (graphics->proj_view_mat).m[5];
        uVar23 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        uVar24 = *(undefined8 *)((graphics->proj_view_mat).m + 8);
        uStack_1080 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        local_1078 = *(undefined8 *)((graphics->proj_view_mat).m + 0xc);
        uStack_1070 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        local_10a8.scale.y = (float)uVar24;
        local_10a8.scale.z = (float)((ulong)uVar24 >> 0x20);
        local_10a8.rotation.w = (float)uVar23;
        local_10a8.scale.x = (float)((ulong)uVar23 >> 0x20);
        local_10a8.position.z = (float)uVar22;
        local_10a8.rotation.x = (float)((ulong)uVar22 >> 0x20);
        m_21.m[3] = local_10a8.rotation.x;
        m_21.m._0_12_ = *(undefined1 (*) [12])pmVar50->m;
        m_21.m[4] = local_10a8.rotation.y;
        m_21.m[5] = local_10a8.rotation.z;
        m_21.m[6] = local_10a8.rotation.w;
        m_21.m[7] = local_10a8.scale.x;
        m_21.m[8] = local_10a8.scale.y;
        m_21.m[9] = local_10a8.scale.z;
        m_21.m[10] = (float)(int)uStack_1080;
        m_21.m[0xb] = (float)(int)((ulong)uStack_1080 >> 0x20);
        m_21.m[0xc] = (float)(int)local_1078;
        m_21.m[0xd] = (float)(int)((ulong)local_1078 >> 0x20);
        m_21.m[0xe] = (float)(int)uStack_1070;
        m_21.m[0xf] = (float)((ulong)uStack_1070 >> 0x20);
        mat4_transpose(m_21);
        m_22.m[2] = (float)local_1138.m[2];
        m_22.m[0] = local_1138.m[0];
        m_22.m[1] = local_1138.m[1];
        m_22.m[3] = (float)local_1138.m[3];
        m_22.m[4] = (float)local_1138.m[4];
        m_22.m[5] = (float)local_1138.m[5];
        m_22.m[6] = (float)local_1138.m[6];
        m_22.m[7] = (float)local_1138.m[7];
        m_22.m[8] = local_1138.m[8];
        m_22.m[9] = local_1138.m[9];
        m_22.m[10] = local_1138.m[10];
        m_22.m[0xb] = local_1138.m[0xb];
        m_22.m[0xc] = (float)local_1138.m[0xc];
        m_22.m[0xd] = (float)local_1138.m[0xd];
        m_22.m[0xe] = (float)local_1138.m[0xe];
        m_22.m[0xf] = local_1138.m[0xf];
        golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_22);
        local_fa0.ptr = pgVar42->data;
        local_fa0.size = (size_t)pgVar42->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fa0);
        pgVar42 = golf_shader_get_fs_uniform(pgVar40,"editor_water_fs_params");
        golf_shader_uniform_set_float(pgVar42,"draw_type",0.0);
        golf_shader_uniform_set_float(pgVar42,"t",editor->t);
        local_fb0.ptr = pgVar42->data;
        local_fb0.size = (size_t)pgVar42->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fb0);
        sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
        iVar35 = (level->entities).length;
      }
      lVar53 = lVar53 + 1;
      lVar55 = lVar55 + 0x510;
    } while (lVar53 < iVar35);
  }
  pgVar40 = golf_data_get_shader("data/shaders/pass_through.glsl");
  pgVar41 = golf_shader_get_pipeline(pgVar40,"hole_pass_1");
  sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
  iVar35 = (level->entities).length;
  if (0 < iVar35) {
    lVar55 = 0;
    lVar53 = 0;
    do {
      pgVar54 = (level->entities).data;
      if ((pgVar54->name[lVar55 + -0xc] == '\x01') && (*(int *)(pgVar54->name + lVar55 + -4) == 2))
      {
        uVar22 = *(undefined8 *)(pgVar54->name + lVar55 + 0x44);
        uStack_1040 = *(undefined8 *)(pgVar54->name + lVar55 + 0x44 + 8);
        local_1038 = *(undefined8 *)(pgVar54->name + lVar55 + 0x54);
        uStack_1030 = *(undefined8 *)(pgVar54->name + lVar55 + 0x54 + 8);
        local_1028 = *(undefined8 *)(pgVar54->name + lVar55 + 100);
        local_1048._4_4_ = (float)((ulong)uVar22 >> 0x20);
        local_1048._0_4_ = (undefined4)uVar22;
        local_1048 = CONCAT44(local_1048._4_4_ + 0.001,(undefined4)local_1048);
        transform_04.position.y = (float)in_stack_ffffffffffffef14;
        transform_04.position.x = (float)in_stack_ffffffffffffef10;
        transform_04.position.z = (float)(int)in_stack_ffffffffffffef18;
        transform_04.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
        transform_04.rotation.y = (float)in_stack_ffffffffffffef20.id;
        transform_04.rotation.z = (float)in_stack_ffffffffffffef24.id;
        transform_04.rotation.w = (float)in_stack_ffffffffffffef28;
        transform_04.scale.x = SUB84(in_stack_ffffffffffffef28,4);
        transform_04.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
        transform_04.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
        golf_transform_get_model_mat(transform_04);
        pgVar38 = golf_data_get_model("data/models/hole-cover.obj");
        pgVar42 = golf_shader_get_vs_uniform(pgVar40,"pass_through_vs_params");
        local_cd8 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_cd0 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        pfVar1 = (graphics->proj_view_mat).m + 4;
        uVar22 = *(undefined8 *)pfVar1;
        uVar23 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_cc8 = *(undefined1 (*) [16])pfVar1;
        pfVar1 = (graphics->proj_view_mat).m + 8;
        uVar24 = *(undefined8 *)pfVar1;
        uVar25 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        local_cb8 = *(undefined1 (*) [16])pfVar1;
        pfVar1 = (graphics->proj_view_mat).m + 0xc;
        uVar26 = *(undefined8 *)pfVar1;
        uVar27 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        local_ca8 = *(undefined1 (*) [16])pfVar1;
        m1.m[3] = (float)SUB84(_sStack_cd0,4);
        m1.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m1.m[4] = (float)(int)uVar22;
        m1.m[5] = (float)(int)((ulong)uVar22 >> 0x20);
        m1.m[6] = (float)(int)uVar23;
        m1.m[7] = (float)(int)((ulong)uVar23 >> 0x20);
        m1.m[8] = (float)(int)uVar24;
        m1.m[9] = (float)(int)((ulong)uVar24 >> 0x20);
        m1.m[10] = (float)(int)uVar25;
        m1.m[0xb] = (float)(int)((ulong)uVar25 >> 0x20);
        m1.m[0xc] = (float)(int)uVar26;
        m1.m[0xd] = (float)(int)((ulong)uVar26 >> 0x20);
        m1.m[0xe] = (float)(int)uVar27;
        m1.m[0xf] = (float)((ulong)uVar27 >> 0x20);
        m2.m[2] = (float)local_4f8._8_4_;
        m2.m[3] = (float)local_4f8._12_4_;
        m2.m[0] = (float)local_4f8._0_4_;
        m2.m[1] = (float)local_4f8._4_4_;
        m2.m[4] = (float)local_4e8[0].id;
        m2.m[5] = (float)local_4e8[1].id;
        m2.m[6] = (float)asStack_4e0[0].id;
        m2.m[7] = (float)asStack_4e0[1].id;
        m2.m._32_8_ = local_4d8;
        m2.m[10] = (float)aiStack_4d0[0];
        m2.m[0xb] = (float)aiStack_4d0[1];
        m2.m[0xc] = (float)local_4c8[0];
        m2.m[0xd] = (float)local_4c8[1];
        m2.m[0xe] = (float)aiStack_4c0[0];
        m2.m[0xf] = (float)aiStack_4c0[1];
        mat4_multiply(m1,m2);
        m_23.m[2] = local_de0.position.z;
        m_23.m[0] = local_de0.position.x;
        m_23.m[1] = local_de0.position.y;
        m_23.m[3] = local_de0.rotation.x;
        m_23.m[4] = local_de0.rotation.y;
        m_23.m[5] = local_de0.rotation.z;
        m_23.m[6] = local_de0.rotation.w;
        m_23.m[7] = local_de0.scale.x;
        m_23.m[8] = local_de0.scale.y;
        m_23.m[9] = local_de0.scale.z;
        m_23.m[10] = (float)(int)uStack_db8;
        m_23.m[0xb] = (float)(int)((ulong)uStack_db8 >> 0x20);
        m_23.m[0xc] = (float)(int)local_db0;
        m_23.m[0xd] = (float)(int)((ulong)local_db0 >> 0x20);
        m_23.m[0xe] = (float)(int)uStack_da8;
        m_23.m[0xf] = (float)((ulong)uStack_da8 >> 0x20);
        mat4_transpose(m_23);
        m_24.m[2] = local_10a8.position.z;
        m_24.m[0] = local_10a8.position.x;
        m_24.m[1] = local_10a8.position.y;
        m_24.m[3] = local_10a8.rotation.x;
        m_24.m[4] = local_10a8.rotation.y;
        m_24.m[5] = local_10a8.rotation.z;
        m_24.m[6] = local_10a8.rotation.w;
        m_24.m[7] = local_10a8.scale.x;
        m_24.m[8] = local_10a8.scale.y;
        m_24.m[9] = local_10a8.scale.z;
        m_24.m[10] = (float)(undefined4)uStack_1080;
        m_24.m[0xb] = (float)uStack_1080._4_4_;
        m_24.m[0xc] = (float)(int)local_1078;
        m_24.m[0xd] = (float)(int)((ulong)local_1078 >> 0x20);
        m_24.m[0xe] = (float)(int)uStack_1070;
        m_24.m[0xf] = (float)((ulong)uStack_1070 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar42,"mvp_mat",m_24);
        local_fc0.ptr = pgVar42->data;
        local_fc0.size = (size_t)pgVar42->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fc0);
        memset((sg_bindings *)local_cd8,0,0xb0);
        local_cd8._4_4_ = (pgVar38->sg_positions_buf).id;
        sg_apply_bindings((sg_bindings *)local_cd8);
        sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
        iVar35 = (level->entities).length;
      }
      lVar53 = lVar53 + 1;
      lVar55 = lVar55 + 0x510;
    } while (lVar53 < iVar35);
  }
  pgVar40 = golf_data_get_shader("data/shaders/texture_material.glsl");
  pgVar41 = golf_shader_get_pipeline(pgVar40,"hole_pass_2");
  sg_apply_pipeline((sg_pipeline)(pgVar41->sg_pipeline).id);
  iVar35 = (level->entities).length;
  if (0 < iVar35) {
    lVar53 = 0;
    lVar55 = 0;
    do {
      pgVar54 = (level->entities).data;
      if ((pgVar54->name[lVar53 + -0xc] == '\x01') && (*(int *)(pgVar54->name + lVar53 + -4) == 2))
      {
        uVar22 = *(undefined8 *)(pgVar54->name + lVar53 + 0x44);
        uStack_1000 = *(undefined8 *)(pgVar54->name + lVar53 + 0x44 + 8);
        local_ff8 = *(undefined8 *)(pgVar54->name + lVar53 + 0x54);
        uStack_ff0 = *(undefined8 *)(pgVar54->name + lVar53 + 0x54 + 8);
        local_fe8 = *(undefined8 *)(pgVar54->name + lVar53 + 100);
        fStack_1004 = (float)((ulong)uVar22 >> 0x20);
        _local_1008 = CONCAT44(fStack_1004 + 0.001,(int)uVar22);
        transform_05.position.y = (float)in_stack_ffffffffffffef14;
        transform_05.position.x = (float)in_stack_ffffffffffffef10;
        transform_05.position.z = (float)(int)in_stack_ffffffffffffef18;
        transform_05.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
        transform_05.rotation.y = (float)in_stack_ffffffffffffef20.id;
        transform_05.rotation.z = (float)in_stack_ffffffffffffef24.id;
        transform_05.rotation.w = (float)in_stack_ffffffffffffef28;
        transform_05.scale.x = SUB84(in_stack_ffffffffffffef28,4);
        transform_05.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
        transform_05.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
        golf_transform_get_model_mat(transform_05);
        pgVar38 = golf_data_get_model("data/models/hole.obj");
        pgVar39 = golf_data_get_texture("data/textures/hole_lightmap.png");
        pgVar42 = golf_shader_get_vs_uniform(pgVar40,"texture_material_vs_params");
        local_cd8 = *(undefined1 (*) [8])(graphics->proj_view_mat).m;
        _sStack_cd0 = *(undefined8 *)((graphics->proj_view_mat).m + 2);
        pfVar1 = (graphics->proj_view_mat).m + 4;
        uVar22 = *(undefined8 *)pfVar1;
        uVar23 = *(undefined8 *)((graphics->proj_view_mat).m + 6);
        local_cc8 = *(undefined1 (*) [16])pfVar1;
        pfVar1 = (graphics->proj_view_mat).m + 8;
        uVar24 = *(undefined8 *)pfVar1;
        uVar25 = *(undefined8 *)((graphics->proj_view_mat).m + 10);
        local_cb8 = *(undefined1 (*) [16])pfVar1;
        pfVar1 = (graphics->proj_view_mat).m + 0xc;
        uVar26 = *(undefined8 *)pfVar1;
        uVar27 = *(undefined8 *)((graphics->proj_view_mat).m + 0xe);
        local_ca8 = *(undefined1 (*) [16])pfVar1;
        m_25.m[3] = (float)SUB84(_sStack_cd0,4);
        m_25.m._0_12_ = *(undefined1 (*) [12])(graphics->proj_view_mat).m;
        m_25.m[4] = (float)(int)uVar22;
        m_25.m[5] = (float)(int)((ulong)uVar22 >> 0x20);
        m_25.m[6] = (float)(int)uVar23;
        m_25.m[7] = (float)(int)((ulong)uVar23 >> 0x20);
        m_25.m[8] = (float)(int)uVar24;
        m_25.m[9] = (float)(int)((ulong)uVar24 >> 0x20);
        m_25.m[10] = (float)(int)uVar25;
        m_25.m[0xb] = (float)(int)((ulong)uVar25 >> 0x20);
        m_25.m[0xc] = (float)(int)uVar26;
        m_25.m[0xd] = (float)(int)((ulong)uVar26 >> 0x20);
        m_25.m[0xe] = (float)(int)uVar27;
        m_25.m[0xf] = (float)((ulong)uVar27 >> 0x20);
        mat4_transpose(m_25);
        m_26.m[2] = (float)(int)uStack_1040;
        m_26.m[0] = (float)(undefined4)local_1048;
        m_26.m[1] = local_1048._4_4_;
        m_26.m[3] = (float)(int)((ulong)uStack_1040 >> 0x20);
        m_26.m[4] = (float)(int)local_1038;
        m_26.m[5] = (float)(int)((ulong)local_1038 >> 0x20);
        m_26.m[6] = (float)(int)uStack_1030;
        m_26.m[7] = (float)(int)((ulong)uStack_1030 >> 0x20);
        m_26.m[8] = (float)(int)local_1028;
        m_26.m[9] = (float)(int)((ulong)local_1028 >> 0x20);
        m_26.m[10] = (float)(int)uStack_1020;
        m_26.m[0xb] = (float)(int)((ulong)uStack_1020 >> 0x20);
        m_26.m[0xc] = (float)(int)local_1018;
        m_26.m[0xd] = (float)(int)((ulong)local_1018 >> 0x20);
        m_26.m[0xe] = (float)(int)uStack_1010;
        m_26.m[0xf] = (float)((ulong)uStack_1010 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar42,"proj_view_mat",m_26);
        m_27.m[2] = (float)(uint32_t)local_4f8._8_8_;
        m_27.m[0] = (float)local_4f8._0_4_;
        m_27.m[1] = (float)local_4f8._4_4_;
        m_27.m[3] = (float)SUB84(local_4f8._8_8_,4);
        m_27.m[4] = (float)local_4e8[0].id;
        m_27.m[5] = (float)local_4e8[1].id;
        m_27.m[6] = (float)asStack_4e0[0].id;
        m_27.m[7] = (float)asStack_4e0[1].id;
        m_27.m[8] = (float)local_4d8._0_4_;
        m_27.m[9] = (float)local_4d8._4_4_;
        m_27.m[10] = (float)aiStack_4d0[0];
        m_27.m[0xb] = (float)aiStack_4d0[1];
        m_27.m[0xc] = (float)local_4c8[0];
        m_27.m[0xd] = (float)local_4c8[1];
        m_27.m[0xe] = (float)(int)aiStack_4c0._0_8_;
        m_27.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
        mat4_transpose(m_27);
        m_28.m[2] = (float)(int)uStack_7f0;
        m_28.m[0] = (float)(undefined4)local_7f8;
        m_28.m[1] = (float)local_7f8._4_4_;
        m_28.m[3] = (float)(int)((ulong)uStack_7f0 >> 0x20);
        m_28.m[4] = (float)(int)local_7e8;
        m_28.m[5] = (float)(int)((ulong)local_7e8 >> 0x20);
        m_28.m[6] = (float)(int)uStack_7e0;
        m_28.m[7] = (float)(int)((ulong)uStack_7e0 >> 0x20);
        m_28.m[8] = (float)local_7d8;
        m_28.m[9] = (float)uStack_7d4;
        m_28.m[10] = (float)uStack_7d0;
        m_28.m[0xb] = (float)uStack_7cc;
        m_28.m[0xc] = (float)(int)local_7c8;
        m_28.m[0xd] = (float)(int)((ulong)local_7c8 >> 0x20);
        m_28.m[0xe] = (float)(int)uStack_7c0;
        m_28.m[0xf] = (float)((ulong)uStack_7c0 >> 0x20);
        golf_shader_uniform_set_mat4(pgVar42,"model_mat",m_28);
        local_fd0.ptr = pgVar42->data;
        local_fd0.size = (size_t)pgVar42->size;
        sg_apply_uniforms(SG_SHADERSTAGE_VS,L'\0',&local_fd0);
        pgVar42 = golf_shader_get_fs_uniform(pgVar40,"fs_params");
        golf_shader_uniform_set_float(pgVar42,"alpha",1.0);
        local_fe0.ptr = pgVar42->data;
        local_fe0.size = (size_t)pgVar42->size;
        sg_apply_uniforms(SG_SHADERSTAGE_FS,L'\0',&local_fe0);
        memset((sg_bindings *)local_cd8,0,0xb0);
        local_cd8._4_4_ = (pgVar38->sg_positions_buf).id;
        uVar7 = pgVar38->sg_normals_buf;
        uVar15 = pgVar38->sg_texcoords_buf;
        sStack_ccc.id = uVar7;
        sStack_cd0.id = uVar15;
        local_c88._44_4_ = (pgVar39->sg_image).id;
        sg_apply_bindings((sg_bindings *)local_cd8);
        sg_draw(L'\0',(pgVar38->positions).length,L'\x01');
        iVar35 = (level->entities).length;
      }
      lVar55 = lVar55 + 1;
      lVar53 = lVar53 + 0x510;
    } while (lVar55 < iVar35);
  }
  if (editor->in_edit_mode == true) {
    pgVar18 = (editor->edit_mode).geo;
    transform_06.position.y = (float)in_stack_ffffffffffffef14;
    transform_06.position.x = (float)in_stack_ffffffffffffef10;
    transform_06.position.z = (float)(int)in_stack_ffffffffffffef18;
    transform_06.rotation.x = (float)(int)((ulong)in_stack_ffffffffffffef18 >> 0x20);
    transform_06.rotation.y = (float)in_stack_ffffffffffffef20.id;
    transform_06.rotation.z = (float)in_stack_ffffffffffffef24.id;
    transform_06.rotation.w = (float)in_stack_ffffffffffffef28;
    transform_06.scale.x = SUB84(in_stack_ffffffffffffef28,4);
    transform_06.scale.y = (float)(uint32_t)in_stack_ffffffffffffef30;
    transform_06.scale.z = (float)SUB84(in_stack_ffffffffffffef30,4);
    golf_transform_get_model_mat(transform_06);
    iVar35 = (pgVar18->points).length;
    if (0 < iVar35) {
      lVar53 = 0;
      lVar55 = 0;
      do {
        pgVar19 = (pgVar18->points).data;
        if (((&pgVar19->active)[lVar53] & 1U) != 0) {
          m_29.m[2] = (float)(uint32_t)local_4f8._8_8_;
          m_29.m[0] = (float)local_4f8._0_4_;
          m_29.m[1] = (float)local_4f8._4_4_;
          m_29.m[3] = (float)SUB84(local_4f8._8_8_,4);
          m_29.m[4] = (float)local_4e8[0].id;
          m_29.m[5] = (float)local_4e8[1].id;
          m_29.m[6] = (float)asStack_4e0[0].id;
          m_29.m[7] = (float)asStack_4e0[1].id;
          m_29.m[8] = (float)local_4d8._0_4_;
          m_29.m[9] = (float)local_4d8._4_4_;
          m_29.m[10] = (float)aiStack_4d0[0];
          m_29.m[0xb] = (float)aiStack_4d0[1];
          m_29.m[0xc] = (float)local_4c8[0];
          m_29.m[0xd] = (float)local_4c8[1];
          m_29.m[0xe] = (float)(int)aiStack_4c0._0_8_;
          m_29.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
          v_02.z = *(float *)((long)&(pgVar19->position).z + lVar53);
          v_02._0_8_ = *(undefined8 *)((long)&(pgVar19->position).x + lVar53);
          vVar61 = vec3_apply_mat4(v_02,1.0,m_29);
          fVar59 = golf_config_get_num(cfg,"edit_mode_sphere_size");
          mat4_translation(&local_838,vVar61);
          vVar61 = vec3_create(fVar59,fVar59,fVar59);
          mat4_scale(&local_878,vVar61);
          mat4_multiply_n((mat4 *)&local_ed0,2);
          pgVar38 = golf_data_get_model("data/models/sphere.obj");
          iVar35 = (pgVar38->positions).length;
          vVar61 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
          gVar64 = golf_edit_mode_entity_point((int)lVar55);
          _Var33 = golf_editor_is_edit_entity_hovered(gVar64);
          pcVar49 = "edit_mode_hovered_color";
          if (_Var33) {
LAB_0010fd6a:
            vVar61 = golf_config_get_vec3(cfg,pcVar49);
          }
          else {
            _Var33 = golf_editor_is_edit_entity_selected(gVar64);
            pcVar49 = "edit_mode_selected_color";
            if (_Var33) goto LAB_0010fd6a;
          }
          vVar63 = vec4_create(vVar61.x,vVar61.y,vVar61.z,1.0);
          golf_material_color((golf_material_t *)local_cd8,"",0.0,0.0,0.0,vVar63);
          _golf_renderer_draw_solid_color_material
                    (local_c88._8_8_,(int)local_c88._16_8_,pgVar38,0,iVar35);
          iVar35 = (pgVar18->points).length;
        }
        lVar55 = lVar55 + 1;
        lVar53 = lVar53 + 0x10;
      } while (lVar55 < iVar35);
    }
    if (0 < (pgVar18->faces).length) {
      local_1060 = &pgVar18->model;
      pgVar40 = (golf_shader_t *)0x0;
      do {
        pgVar20 = (pgVar18->faces).data;
        if ((pgVar20[(long)pgVar40].active & 1U) != 0) {
          uVar51 = pgVar20[(long)pgVar40].idx.length;
          iVar35 = pgVar20[(long)pgVar40].start_vertex_in_model;
          local_10f8 = pgVar40;
          if (0 < (int)uVar51) {
            piVar21 = pgVar20[(long)pgVar40].idx.data;
            uVar52 = 1;
            do {
              iVar34 = piVar21[uVar52 - 1];
              uVar46 = 0;
              if (uVar52 != uVar51) {
                uVar46 = uVar52;
              }
              point1_idx = piVar21[uVar46];
              pgVar19 = (pgVar18->points).data;
              uVar8 = pgVar19[iVar34].position.x;
              uVar16 = pgVar19[iVar34].position.y;
              v_03.y = (float)uVar16;
              v_03.x = (float)uVar8;
              uVar9 = pgVar19[point1_idx].position.x;
              uVar17 = pgVar19[point1_idx].position.y;
              v_04.y = (float)uVar17;
              v_04.x = (float)uVar9;
              fVar59 = pgVar19[point1_idx].position.z;
              m_30.m[2] = (float)(uint32_t)local_4f8._8_8_;
              m_30.m[0] = (float)local_4f8._0_4_;
              m_30.m[1] = (float)local_4f8._4_4_;
              m_30.m[3] = (float)SUB84(local_4f8._8_8_,4);
              m_30.m[4] = (float)local_4e8[0].id;
              m_30.m[5] = (float)local_4e8[1].id;
              m_30.m[6] = (float)asStack_4e0[0].id;
              m_30.m[7] = (float)asStack_4e0[1].id;
              m_30.m[8] = (float)local_4d8._0_4_;
              m_30.m[9] = (float)local_4d8._4_4_;
              m_30.m[10] = (float)aiStack_4d0[0];
              m_30.m[0xb] = (float)aiStack_4d0[1];
              m_30.m[0xc] = (float)local_4c8[0];
              m_30.m[0xd] = (float)local_4c8[1];
              m_30.m[0xe] = (float)(int)aiStack_4c0._0_8_;
              m_30.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
              v_03.z = pgVar19[iVar34].position.z;
              vVar62 = vec3_apply_mat4(v_03,1.0,m_30);
              m_31.m[2] = (float)(uint32_t)local_4f8._8_8_;
              m_31.m[0] = (float)local_4f8._0_4_;
              m_31.m[1] = (float)local_4f8._4_4_;
              m_31.m[3] = (float)SUB84(local_4f8._8_8_,4);
              m_31.m[4] = (float)local_4e8[0].id;
              m_31.m[5] = (float)local_4e8[1].id;
              m_31.m[6] = (float)asStack_4e0[0].id;
              m_31.m[7] = (float)asStack_4e0[1].id;
              m_31.m[8] = (float)local_4d8._0_4_;
              m_31.m[9] = (float)local_4d8._4_4_;
              m_31.m[10] = (float)aiStack_4d0[0];
              m_31.m[0xb] = (float)aiStack_4d0[1];
              m_31.m[0xc] = (float)local_4c8[0];
              m_31.m[0xd] = (float)local_4c8[1];
              m_31.m[0xe] = (float)(int)aiStack_4c0._0_8_;
              m_31.m[0xf] = SUB84(aiStack_4c0._0_8_,4);
              v_04.z = fVar59;
              vVar61 = vec3_apply_mat4(v_04,1.0,m_31);
              fVar58 = vVar61.z;
              local_1058 = vVar61._0_8_;
              fVar59 = golf_config_get_num(cfg,"edit_mode_line_size");
              vVar61 = golf_config_get_vec3(cfg,"edit_mode_selectable_color");
              gVar64 = golf_edit_mode_entity_line(iVar34,point1_idx);
              _Var33 = golf_editor_is_edit_entity_hovered(gVar64);
              pcVar49 = "edit_mode_hovered_color";
              if (_Var33) {
LAB_0011003b:
                vVar61 = golf_config_get_vec3(cfg,pcVar49);
                fVar59 = fVar59 + 0.001;
              }
              else {
                _Var33 = golf_editor_is_edit_entity_selected(gVar64);
                pcVar49 = "edit_mode_selected_color";
                if (_Var33) goto LAB_0011003b;
              }
              p1.z = fVar58;
              p1.x = (float)(wchar_t)local_1058;
              p1.y = (float)local_1058._4_4_;
              mat4_box_to_line_transform((mat4 *)&local_ed0,vVar62,p1,fVar59);
              pgVar38 = golf_data_get_model("data/models/cube.obj");
              iVar34 = (pgVar38->positions).length;
              local_1188 = vVar61.x;
              fStack_1184 = vVar61.y;
              vVar63 = vec4_create(local_1188,fStack_1184,vVar61.z,1.0);
              golf_material_color((golf_material_t *)local_cd8,"",0.0,0.0,0.0,vVar63);
              _golf_renderer_draw_solid_color_material
                        (local_c88._8_8_,(int)local_c88._16_8_,pgVar38,0,iVar34);
              bVar56 = uVar52 != uVar51;
              uVar52 = uVar52 + 1;
            } while (bVar56);
          }
          pgVar40 = local_10f8;
          gVar64 = golf_edit_mode_entity_face((int)local_10f8);
          _Var33 = golf_editor_is_edit_entity_hovered(gVar64);
          if (_Var33) {
            vVar61 = golf_config_get_vec3(cfg,"edit_mode_hovered_color");
            fVar59 = golf_config_get_num(cfg,"edit_mode_hovered_face_alpha");
            local_1198 = vVar61.x;
            fStack_1194 = vVar61.y;
            vVar63 = vec4_create(local_1198,fStack_1194,vVar61.z,fVar59);
            golf_material_color((golf_material_t *)local_cd8,"",0.0,0.0,0.0,vVar63);
            _golf_renderer_draw_solid_color_material
                      (local_c88._8_8_,(int)local_c88._16_8_,local_1060,iVar35,uVar51 * 3 + -6);
          }
          else {
            _Var33 = golf_editor_is_edit_entity_selected(gVar64);
            if (_Var33) {
              vVar61 = golf_config_get_vec3(cfg,"edit_mode_selected_color");
              fVar59 = golf_config_get_num(cfg,"edit_mode_selected_face_alpha");
              local_1198 = vVar61.x;
              fStack_1194 = vVar61.y;
              vVar63 = vec4_create(local_1198,fStack_1194,vVar61.z,fVar59);
              golf_material_color((golf_material_t *)local_cd8,"",0.0,0.0,0.0,vVar63);
              _golf_renderer_draw_solid_color_material
                        (local_c88._8_8_,(int)local_c88._16_8_,local_1060,iVar35,uVar51 * 3 + -6);
            }
          }
        }
        pgVar40 = (golf_shader_t *)((pgVar40->file).path + 1);
      } while ((long)pgVar40 < (long)(pgVar18->faces).length);
    }
  }
  sg_end_pass();
  return;
}

Assistant:

void golf_editor_draw(void) {
    golf_config_t *editor_cfg = golf_data_get_config("data/config/editor.cfg");

    sg_pass_action action = {
        .colors[0] = {
            .action = SG_ACTION_CLEAR,
            .value = { 0, 0, 0, 1 },
        },
    };
    sg_begin_default_pass(&action, (int)graphics->viewport_size.x, (int)graphics->viewport_size.y);

    _draw_level();

    if (editor->in_edit_mode) {
        golf_geo_t *geo = editor->edit_mode.geo;
        mat4 model_mat = golf_transform_get_model_mat(editor->edit_mode.transform);

        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t p = geo->points.data[i];
            if (!p.active) continue;

            vec3 pos = vec3_apply_mat4(p.position, 1, model_mat);
            float sz = CFG_NUM(editor_cfg, "edit_mode_sphere_size");
            mat4 sphere_model_mat = mat4_multiply_n(2, mat4_translation(pos), mat4_scale(V3(sz, sz, sz)));
            golf_model_t *model = golf_data_get_model("data/models/sphere.obj");
            int start = 0;
            int count = model->positions.length;
            vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
            golf_edit_mode_entity_t entity = golf_edit_mode_entity_point(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {  
                color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
            }
            golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
            _golf_renderer_draw_solid_color_material(model, start, count, sphere_model_mat, material);
        }

        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];
            if (!face.active) continue;

            int n = face.idx.length;
            for (int i = 0; i < n; i++) {
                int idx0 = face.idx.data[i];
                int idx1 = face.idx.data[(i + 1) % n];
                golf_geo_point_t p0 = geo->points.data[idx0];
                golf_geo_point_t p1 = geo->points.data[idx1];
                vec3 pos0 = vec3_apply_mat4(p0.position, 1, model_mat);
                vec3 pos1 = vec3_apply_mat4(p1.position, 1, model_mat);
                //vec3 pos_avg = vec3_scale(vec3_add(pos0, pos1), 0.5f);
                float sz = CFG_NUM(editor_cfg, "edit_mode_line_size");
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selectable_color");
                golf_edit_mode_entity_t entity = golf_edit_mode_entity_line(idx0, idx1);
                if (golf_editor_is_edit_entity_hovered(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                    sz += 0.001f;
                }
                else if (golf_editor_is_edit_entity_selected(entity)) {
                    color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                    sz += 0.001f;
                }
                mat4 line_model_mat = mat4_box_to_line_transform(pos0, pos1, sz);
                golf_model_t *model = golf_data_get_model("data/models/cube.obj");
                int start = 0;
                int count = model->positions.length;
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, 1));
                _golf_renderer_draw_solid_color_material(model, start, count, line_model_mat, material);
            }

            golf_edit_mode_entity_t entity = golf_edit_mode_entity_face(i);
            if (golf_editor_is_edit_entity_hovered(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_hovered_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_hovered_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
            else if (golf_editor_is_edit_entity_selected(entity)) {
                golf_model_t *model = &geo->model;
                int start_vertex = face.start_vertex_in_model;
                int count = 3 * (n - 2);
                vec3 color = CFG_VEC3(editor_cfg, "edit_mode_selected_color");
                float alpha = CFG_NUM(editor_cfg, "edit_mode_selected_face_alpha");
                golf_material_t material = golf_material_color("", 0, 0, 0, V4(color.x, color.y, color.z, alpha));
                _golf_renderer_draw_solid_color_material(model, start_vertex, count, model_mat, material);
            }
        }
    }

    sg_end_pass();
}